

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_losertree.cpp
# Opt level: O0

void mergesort_losertree_parallel<256u>(uchar **strings,size_t n,uchar **tmp)

{
  uchar **strings_00;
  size_t n_00;
  ostream *poVar1;
  ulong uVar2;
  reference pvVar3;
  iterator begin;
  iterator end;
  uchar *puVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 local_1090 [8];
  loser_tree<unsigned_char_*> tree;
  uchar **result;
  unsigned_long uStack_1068;
  uint i_1;
  uchar **local_1060;
  pair<unsigned_char_**,_unsigned_long> local_1058;
  uchar **local_1048;
  pair<unsigned_char_**,_unsigned_long> local_1040;
  uint local_102c;
  undefined1 local_1028 [4];
  uint i;
  array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> ranges;
  size_t split;
  uchar **tmp_local;
  size_t n_local;
  uchar **strings_local;
  
  if (n < 0x10000) {
    mergesort_4way_parallel(strings,n,tmp);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
    poVar1 = std::operator<<(poVar1,"mergesort_losertree_parallel");
    poVar1 = std::operator<<(poVar1,"(), n=");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,n);
    std::operator<<(poVar1,"\n");
    auVar6._8_4_ = (int)(n >> 0x20);
    auVar6._0_8_ = n;
    auVar6._12_4_ = 0x45300000;
    dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)n) - 4503599627370496.0)) * 0.00390625;
    uVar2 = (ulong)dVar5;
    ranges._M_elems[0xff].second =
         uVar2 | (long)(dVar5 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::array
              ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028);
    for (local_102c = 0; local_102c < 0xff; local_102c = local_102c + 1) {
      local_1048 = strings + local_102c * ranges._M_elems[0xff].second;
      local_1040 = std::make_pair<unsigned_char**,unsigned_long_const&>
                             (&local_1048,&ranges._M_elems[0xff].second);
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028,
                          (ulong)local_102c);
      std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_1040);
    }
    local_1060 = strings + ranges._M_elems[0xff].second * 0xff;
    uStack_1068 = n + ranges._M_elems[0xff].second * -0xff;
    local_1058 = std::make_pair<unsigned_char**,unsigned_long>(&local_1060,&stack0xffffffffffffef98)
    ;
    pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::operator[]
                       ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028,0xff)
    ;
    std::pair<unsigned_char_**,_unsigned_long>::operator=(pvVar3,&local_1058);
    for (result._4_4_ = 0; result._4_4_ < 0x100; result._4_4_ = result._4_4_ + 1) {
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028,
                          (ulong)result._4_4_);
      strings_00 = pvVar3->first;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028,
                          (ulong)result._4_4_);
      n_00 = pvVar3->second;
      pvVar3 = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::operator[]
                         ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028,
                          (ulong)result._4_4_);
      mergesort_losertree_parallel<256u>
                (strings_00,n_00,tmp + ((long)pvVar3->first - (long)strings >> 3));
    }
    tree._16_8_ = tmp;
    begin = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::begin
                      ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028);
    end = std::array<std::pair<unsigned_char_**,_unsigned_long>,_256UL>::end
                    ((array<std::pair<unsigned_char_**,_unsigned_long>,_256UL> *)local_1028);
    loser_tree<unsigned_char*>::loser_tree<std::pair<unsigned_char**,unsigned_long>*>
              ((loser_tree<unsigned_char*> *)local_1090,begin,end);
    while ((int)tree._streams != 0) {
      puVar4 = loser_tree<unsigned_char_*>::min((loser_tree<unsigned_char_*> *)local_1090);
      *(uchar **)tree._16_8_ = puVar4;
      tree._16_8_ = tree._16_8_ + 8;
    }
    memcpy(strings,tmp,n << 3);
    loser_tree<unsigned_char_*>::~loser_tree((loser_tree<unsigned_char_*> *)local_1090);
  }
  return;
}

Assistant:

static void
mergesort_losertree_parallel(unsigned char** strings, size_t n, unsigned char** tmp)
{
	if (n < 0x10000) {
		mergesort_4way_parallel(strings, n, tmp);
		return;
	}
	debug() << __func__ << "(), n="<<n<<"\n";
	const size_t split = size_t(double(n) / double(K));
	std::array<std::pair<unsigned char**, size_t>, K> ranges;
	for (unsigned i=0; i < K-1; ++i) {
		ranges[i] = std::make_pair(strings+i*split, split);
	}
	ranges[K-1] = std::make_pair(strings+(K-1)*split, n-(K-1)*split);
#pragma omp parallel for
	for (unsigned i=0; i < K; ++i) {
		mergesort_losertree_parallel<K>(ranges[i].first, ranges[i].second,
				tmp+(ranges[i].first-strings));
	}
	unsigned char** result = tmp;
	loser_tree<unsigned char*> tree(ranges.begin(), ranges.end());
	while (tree._nonempty_streams) { *result++ = tree.min(); }
	(void) memcpy(strings, tmp, n*sizeof(unsigned char*));
}